

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::NativeCoordMappingCase::executeForConfig
          (NativeCoordMappingCase *this,EGLDisplay display,EGLConfig config)

{
  NativeType NVar1;
  TestLog *pTVar2;
  NativeDisplay *pNVar3;
  GLsizei GVar4;
  GLsizei GVar5;
  bool bVar6;
  EGLint EVar7;
  deUint32 dVar8;
  int iVar9;
  GLenum GVar10;
  int iVar11;
  Library *pLVar12;
  NativeWindowFactory *pNVar13;
  NativePixmapFactory *pNVar14;
  NotSupportedError *pNVar15;
  undefined4 extraout_var;
  NativeWindow *window;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EGLSurface pvVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TestError *this_00;
  undefined4 uVar17;
  _func_int **pp_Var18;
  IVec2 surfaceSize;
  UniqueSurface surface;
  TextureLevel result;
  UniqueContext context;
  ScopedLogSection logSection;
  IVec2 screenSize;
  string configIdStr;
  Functions gl;
  int in_stack_ffffffffffffe4e8;
  int iVar19;
  GLsizei local_1b00;
  GLsizei local_1afc;
  string local_1af8;
  TestLog *local_1ad8;
  undefined1 local_1ad0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa8;
  ScopedLogSection local_1a88;
  allocator<char> local_1a80 [4];
  int local_1a7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a78;
  undefined1 local_1a58 [8];
  undefined4 local_1a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a48 [6];
  ios_base local_19e8 [8];
  ios_base local_19e0 [272];
  glClearFunc local_18d0;
  glClearColorFunc local_1898;
  glEnableFunc local_1478;
  glGetErrorFunc local_1258;
  glScissorFunc local_7c8;
  
  pLVar12 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3028);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a58);
  std::ostream::operator<<((ostringstream *)local_1a58,EVar7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a58);
  std::ios_base::~ios_base(local_19e8);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1ad0,
                 "Config ID ",&local_1a78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a58,(char *)local_1ad0._0_8_,local_1a80);
  std::operator+(&local_1aa8,"Config ID ",&local_1a78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1af8,local_1aa8._M_dataplus._M_p,(allocator<char> *)&local_1b00);
  tcu::ScopedLogSection::ScopedLogSection(&local_1a88,pTVar2,(string *)local_1a58,&local_1af8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af8._M_dataplus._M_p != &local_1af8.field_2) {
    operator_delete(local_1af8._M_dataplus._M_p,local_1af8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1aa8._M_dataplus._M_p != &local_1aa8.field_2) {
    operator_delete(local_1aa8._M_dataplus._M_p,local_1aa8.field_2._M_allocated_capacity + 1);
  }
  if (local_1a58 != (undefined1  [8])local_1a48) {
    operator_delete((void *)local_1a58,local_1a48[0]._M_allocated_capacity + 1);
  }
  if (local_1ad0._0_8_ != (long)local_1ad0 + 0x10) {
    operator_delete((void *)local_1ad0._0_8_,local_1ad0._16_8_ + 1);
  }
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  NVar1 = this->m_nativeType;
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_RED_SIZE: ",0xe);
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3024);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_GREEN_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3023);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_BLUE_SIZE: ",0xf);
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3022);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_ALPHA_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3021);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_DEPTH_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3025);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a50,"EGL_STENCIL_SIZE: ",0x12);
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3026);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_SAMPLES: ",0xd);
  EVar7 = eglu::getConfigAttribInt(pLVar12,display,config,0x3031);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  if (NVar1 == NATIVETYPE_WINDOW) {
    local_1a58 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"Waiting ",8);
    std::ostream::operator<<((ostringstream *)&local_1a50,0x50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a50,
               "ms after eglSwapBuffers() and glFinish() for frame to become visible",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
    std::ios_base::~ios_base(local_19e0);
  }
  pNVar13 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar13->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar15,"Native window doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x209);
    __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar14 = eglu::selectNativePixmapFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if (this->m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) {
    if ((~*(uint *)(pNVar14 + 0x48) & 5) != 0) {
      pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar15,"Native pixmap doesn\'t support readPixels() or legacy create surface",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                 ,0x220);
      goto LAB_00e2e9e3;
    }
  }
  else if ((this->m_nativeType == NATIVETYPE_PIXMAP) && (((byte)pNVar14[0x48] & 4) == 0)) {
    pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar15,"Native pixmap doesn\'t support readPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x21a);
LAB_00e2e9e3:
    __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1a58 = (undefined1  [8])0x200003098;
  local_1a50 = 0x3038;
  (**pLVar12->_vptr_Library)(pLVar12,0x30a0);
  dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
  eglu::checkError(dVar8,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                   ,0x50);
  iVar9 = (*pLVar12->_vptr_Library[6])(pLVar12,display,config,0);
  dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
  eglu::checkError(dVar8,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                   ,0x53);
  if ((EGLContext)CONCAT44(extraout_var,iVar9) == (EGLContext)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
               ,0x54);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            ((UniqueContext *)&local_1aa8,pLVar12,display,(EGLContext)CONCAT44(extraout_var,iVar9));
  glw::Functions::Functions((Functions *)local_1a58);
  EglTestContext::initGLFunctions
            ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,(Functions *)local_1a58,
             (ApiType)0x2);
  NVar1 = this->m_nativeType;
  if (NVar1 == NATIVETYPE_WINDOW) {
    iVar9 = (int)local_1ad0;
    local_1ad0._0_4_ = 0x80;
    local_1ad0._4_4_ = 0x80;
    local_1ad0._8_4_ = 1;
    iVar11 = (*(pNVar13->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                       (pNVar13,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config);
    window = (NativeWindow *)CONCAT44(extraout_var_02,iVar11);
    local_1ad8 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
    pNVar3 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar6 = this->m_render;
    iVar19 = (*pNVar3->_vptr_NativeDisplay[2])(pNVar3);
    pLVar12 = (Library *)CONCAT44(extraout_var_03,iVar19);
    (*window->_vptr_NativeWindow[7])(local_1a80);
    pvVar16 = eglu::createWindowSurface(pNVar3,window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&local_1af8,pLVar12,display,pvVar16);
    eglu::getSurfaceSize
              ((eglu *)&local_1b00,pLVar12,display,
               (EGLSurface)local_1af8.field_2._M_allocated_capacity);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1ad0);
    uVar17 = local_1aa8.field_2._M_allocated_capacity._0_4_;
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,local_1af8.field_2._M_allocated_capacity);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x17d);
    dVar8 = 0;
    if (bVar6 != false) {
      dVar8 = createGLES2Program((Functions *)local_1a58,local_1ad8);
    }
    GVar5 = local_1afc;
    GVar4 = local_1b00;
    (*local_1478)(0xc11);
    (*local_7c8)(0,0,GVar4,GVar5);
    (*local_1898)(0.0,0.0,0.0,1.0);
    (*local_18d0)(0x4000);
    GVar10 = (*local_1258)();
    glu::checkError(GVar10,"Color clear failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                    ,0xda);
    if (bVar6 == false) {
      (*local_1478)(0xc11);
      (*local_7c8)(8,0x10,0x40,0x48);
      (*local_1898)(1.0,1.0,1.0,1.0);
      (*local_18d0)(0x4000);
      GVar10 = (*local_1258)();
      glu::checkError(GVar10,"Color clear failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                      ,0xda);
    }
    else {
      anon_unknown_0::render
                ((Functions *)local_1a58,dVar8,local_1b00,local_1afc,uVar17,iVar9,
                 in_stack_ffffffffffffe4e8,iVar11);
    }
    (*pLVar12->_vptr_Library[0x31])(pLVar12,display,local_1af8.field_2._M_allocated_capacity);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"swapBuffers(display, *surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x189);
    (*pLVar12->_vptr_Library[0x36])(pLVar12);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    iVar11 = 0x18a;
    eglu::checkError(dVar8,"waitClient()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x18a);
    deSleep(0x50);
    (*window->_vptr_NativeWindow[8])(window,local_1ad0);
    bVar6 = validate(local_1ad8,(TextureLevel *)local_1ad0,local_1a7c + -0x58,iVar11,uVar17,iVar9);
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,0,0,0);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x191);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1ad0);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1af8);
    if (!bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  else if (NVar1 == NATIVETYPE_PIXMAP) {
    iVar19 = 0x80;
    iVar11 = 0x80;
    window = (NativeWindow *)
             (**(code **)(*(long *)pNVar14 + 0x20))
                       (pNVar14,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config);
    local_1ad8 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
    pNVar3 = (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    bVar6 = this->m_render;
    iVar9 = (*pNVar3->_vptr_NativeDisplay[2])(pNVar3);
    pLVar12 = (Library *)CONCAT44(extraout_var_01,iVar9);
    pvVar16 = eglu::createPixmapSurface
                        (pNVar3,(NativePixmap *)window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface((UniqueSurface *)&local_1af8,pLVar12,display,pvVar16);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1ad0);
    uVar17 = local_1aa8.field_2._M_allocated_capacity._0_4_;
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,local_1af8.field_2._M_allocated_capacity);
    pTVar2 = local_1ad8;
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1ac);
    dVar8 = 0;
    if (bVar6 != false) {
      dVar8 = createGLES2Program((Functions *)local_1a58,pTVar2);
    }
    (*local_1478)(0xc11);
    (*local_7c8)(0,0,0x80,0x80);
    (*local_1898)(0.0,0.0,0.0,1.0);
    (*local_18d0)(0x4000);
    GVar10 = (*local_1258)();
    glu::checkError(GVar10,"Color clear failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                    ,0xda);
    if (bVar6 == false) {
      (*local_1478)(0xc11);
      (*local_7c8)(8,0x10,0x40,0x48);
      (*local_1898)(1.0,1.0,1.0,1.0);
      (*local_18d0)(0x4000);
      GVar10 = (*local_1258)();
      glu::checkError(GVar10,"Color clear failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                      ,0xda);
    }
    else {
      anon_unknown_0::render
                ((Functions *)local_1a58,dVar8,0x80,0x80,uVar17,iVar11,iVar19,(int)window);
    }
    (*pLVar12->_vptr_Library[0x36])(pLVar12);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    iVar9 = 0x1b8;
    eglu::checkError(dVar8,"waitClient()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1b8);
    (*window->_vptr_NativeWindow[4])(window,local_1ad0);
    bVar6 = validate(pTVar2,(TextureLevel *)local_1ad0,0x27,iVar9,uVar17,iVar11);
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,0,0,0);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1be);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1ad0);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1af8);
    if (!bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  else {
    if (NVar1 != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) goto LAB_00e2e8e5;
    iVar19 = 0x80;
    iVar11 = 0x80;
    window = (NativeWindow *)
             (**(code **)(*(long *)pNVar14 + 0x20))
                       (pNVar14,(((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                                m_nativeDisplay).
                                super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                                .m_data.ptr,display,config,0);
    pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
             ->m_log;
    bVar6 = this->m_render;
    iVar9 = (*pLVar12->_vptr_Library[10])(pLVar12,display,config,0);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)&local_1af8,pLVar12,display,
               (EGLSurface)CONCAT44(extraout_var_00,iVar9));
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_1ad0);
    uVar17 = local_1aa8.field_2._M_allocated_capacity._0_4_;
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,local_1af8.field_2._M_allocated_capacity);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, *surface, *surface, context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1d8);
    dVar8 = 0;
    if (bVar6 != false) {
      dVar8 = createGLES2Program((Functions *)local_1a58,pTVar2);
    }
    (*local_1478)(0xc11);
    (*local_7c8)(0,0,0x80,0x80);
    (*local_1898)(0.0,0.0,0.0,1.0);
    (*local_18d0)(0x4000);
    GVar10 = (*local_1258)();
    glu::checkError(GVar10,"Color clear failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                    ,0xda);
    if (bVar6 == false) {
      (*local_1478)(0xc11);
      (*local_7c8)(8,0x10,0x40,0x48);
      (*local_1898)(1.0,1.0,1.0,1.0);
      (*local_18d0)(0x4000);
      GVar10 = (*local_1258)();
      glu::checkError(GVar10,"Color clear failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                      ,0xda);
    }
    else {
      anon_unknown_0::render
                ((Functions *)local_1a58,dVar8,0x80,0x80,uVar17,iVar11,iVar19,(int)window);
    }
    iVar9 = (*window->_vptr_NativeWindow[2])();
    pp_Var18 = pLVar12->_vptr_Library;
    (*pp_Var18[5])(pLVar12,display,local_1af8.field_2._M_allocated_capacity,
                   CONCAT44(extraout_var_04,iVar9));
    iVar19 = (int)pp_Var18;
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"copyBuffers(display, *surface, nativePixmap.getLegacyNative())",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1e4);
    (*pLVar12->_vptr_Library[0x36])(pLVar12);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    iVar9 = 0x1e5;
    eglu::checkError(dVar8,"waitClient()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1e5);
    (*window->_vptr_NativeWindow[4])(window,local_1ad0);
    bVar6 = validate(pTVar2,(TextureLevel *)local_1ad0,0x6f,iVar9,iVar19,iVar11);
    (*pLVar12->_vptr_Library[0x27])(pLVar12,display,0,0,0);
    dVar8 = (*pLVar12->_vptr_Library[0x1f])(pLVar12);
    eglu::checkError(dVar8,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                     ,0x1eb);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1ad0);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&local_1af8);
    if (!bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color rendered");
    }
  }
  (*window->_vptr_NativeWindow[1])();
LAB_00e2e8e5:
  eglu::UniqueContext::~UniqueContext((UniqueContext *)&local_1aa8);
  tcu::TestLog::endSection(local_1a88.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a78._M_dataplus._M_p != &local_1a78.field_2) {
    operator_delete(local_1a78._M_dataplus._M_p,local_1a78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NativeCoordMappingCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const string						configIdStr		(de::toString(eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID)));
	tcu::ScopedLogSection				logSection		(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames		= 5;
	const int							width			= 128;
	const int							height			= 128;
	const eglu::NativeWindowFactory*	windowFactory;
	const eglu::NativePixmapFactory*	pixmapFactory;

	logConfigInfo(m_testCtx.getLog(), egl, display, config, m_nativeType, waitFrames);

	try
	{
		windowFactory = &eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if ((windowFactory->getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
			TCU_THROW(NotSupportedError, "Native window doesn't support readPixels()");
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_WINDOW)
			throw;
		else
			windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		if (m_nativeType == NATIVETYPE_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels()");
		}
		else if (m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
		{
			if ((pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_READ_PIXELS) == 0 ||
				(pixmapFactory->getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support readPixels() or legacy create surface");
		}
	}
	catch (const tcu::NotSupportedError&)
	{
		if (m_nativeType == NATIVETYPE_PIXMAP || m_nativeType == NATIVETYPE_PBUFFER_COPY_TO_PIXMAP)
			throw;
		else
			pixmapFactory = DE_NULL;
	}

	DE_ASSERT(m_nativeType != NATIVETYPE_WINDOW || windowFactory);
	DE_ASSERT((m_nativeType != NATIVETYPE_PIXMAP && m_nativeType != NATIVETYPE_PBUFFER_COPY_TO_PIXMAP) || pixmapFactory);

	eglu::UniqueContext		context		(egl, display, createGLES2Context(egl, display, config));
	glw::Functions			gl;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	switch (m_nativeType)
	{
		case NATIVETYPE_WINDOW:
		{
			de::UniquePtr<eglu::NativeWindow>	nativeWindow	(windowFactory->createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::WindowParams::VISIBILITY_VISIBLE)));

			if (!testNativeWindow(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativeWindow, display, *context, config, gl, m_render, waitFrames))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		case NATIVETYPE_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmap(m_testCtx.getLog(), m_eglTestCtx.getNativeDisplay(), *nativePixmap, width, height, display, *context, config, gl, m_render))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		case NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
		{
			de::UniquePtr<eglu::NativePixmap> nativePixmap		(pixmapFactory->createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));

			if (!testNativePixmapCopy(m_testCtx.getLog(), egl, *nativePixmap, width, height, display, *context, config, gl, m_render))
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color rendered");

			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}